

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::_::
CopyConstructArray_<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry,_kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry_*,_true,_false>
::ExceptionGuard::~ExceptionGuard(ExceptionGuard *this)

{
  Entry *pEVar1;
  ExceptionGuard *this_local;
  
  while (this->start < this->pos) {
    pEVar1 = this->pos;
    this->pos = pEVar1 + -1;
    dtor<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Entry>(pEVar1 + -1);
  }
  return;
}

Assistant:

~ExceptionGuard() noexcept(false) {
      while (pos > start) {
        dtor(*--pos);
      }
    }